

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool __thiscall
duckdb::DictionaryCompressionState::UpdateState
          (DictionaryCompressionState *this,Vector *scan_vector,idx_t count)

{
  uint uVar1;
  int iVar2;
  idx_t iVar3;
  ulong uVar4;
  long lVar5;
  InternalException *this_00;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  allocator local_b1;
  data_ptr_t local_b0;
  idx_t local_a8;
  CompressionInfo *local_a0;
  string local_98;
  UnifiedVectorFormat vdata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  local_a8 = count;
  Vector::ToUnifiedFormat(scan_vector,count,&vdata);
  local_b0 = vdata.data;
  (*(this->super_CompressionState)._vptr_CompressionState[2])(this);
  local_a0 = &(this->super_CompressionState).info;
  for (uVar6 = 0; local_a8 != uVar6; uVar6 = uVar6 + 1) {
    uVar9 = uVar6;
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar9 = (ulong)(vdata.sel)->sel_vector[uVar6];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6] >>
         (uVar9 & 0x3f) & 1) != 0)) {
      uVar1 = *(uint *)(local_b0 + uVar9 * 0x10);
      uVar7 = (ulong)uVar1;
      iVar3 = CompressionInfo::GetBlockSize(local_a0);
      uVar4 = iVar3 >> 2 & 0xfffffffffffffff8;
      if (0xfff < uVar4) {
        uVar4 = 0x1000;
      }
      if ((uint)uVar4 <= uVar1) break;
      iVar2 = (*(this->super_CompressionState)._vptr_CompressionState[3])
                        (this,*(undefined8 *)(local_b0 + uVar9 * 0x10),
                         *(undefined8 *)(local_b0 + uVar9 * 0x10 + 8));
      bVar8 = (byte)iVar2 ^ 1;
      bVar10 = true;
    }
    else {
      bVar10 = false;
      uVar7 = 0;
      bVar8 = 0;
    }
    iVar2 = (*(this->super_CompressionState)._vptr_CompressionState[7])(this,(ulong)bVar8,uVar7);
    if ((char)iVar2 == '\0') {
      (*(this->super_CompressionState)._vptr_CompressionState[8])(this,0);
      iVar2 = (*(this->super_CompressionState)._vptr_CompressionState[7])(this,1,uVar7);
      bVar8 = 1;
      if ((char)iVar2 == '\0') {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_98,"Dictionary compression could not write to new segment",
                   &local_b1);
        InternalException::InternalException(this_00,&local_98);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    lVar5 = 0x30;
    if (bVar10) {
      lVar5 = 0x20;
      if (bVar8 == 0) goto LAB_00a368b3;
      (*(this->super_CompressionState)._vptr_CompressionState[5])
                (this,*(undefined8 *)(local_b0 + uVar9 * 0x10),
                 *(undefined8 *)(local_b0 + uVar9 * 0x10 + 8));
    }
    else {
LAB_00a368b3:
      (**(code **)((long)(this->super_CompressionState)._vptr_CompressionState + lVar5))(this);
    }
    (*(this->super_CompressionState)._vptr_CompressionState[2])(this);
  }
  bVar10 = local_a8 <= uVar6;
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  return bVar10;
}

Assistant:

bool DictionaryCompressionState::UpdateState(Vector &scan_vector, idx_t count) {
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	Verify();

	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		idx_t string_size = 0;
		bool new_string = false;
		auto row_is_valid = vdata.validity.RowIsValid(idx);

		if (row_is_valid) {
			string_size = data[idx].GetSize();
			if (string_size >= StringUncompressed::GetStringBlockLimit(info.GetBlockSize())) {
				// Big strings not implemented for dictionary compression
				return false;
			}
			new_string = !LookupString(data[idx]);
		}

		bool fits = CalculateSpaceRequirements(new_string, string_size);
		if (!fits) {
			Flush();
			new_string = true;

			fits = CalculateSpaceRequirements(new_string, string_size);
			if (!fits) {
				throw InternalException("Dictionary compression could not write to new segment");
			}
		}

		if (!row_is_valid) {
			AddNull();
		} else if (new_string) {
			AddNewString(data[idx]);
		} else {
			AddLastLookup();
		}

		Verify();
	}

	return true;
}